

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O2

nh_bool apply_override_list(curses_symdef_conflict *list,wchar_t len,curses_symdef_conflict *ovr,
                           nh_bool cust)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)len;
  if (len < L'\x01') {
    uVar6 = 0;
  }
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar6 * 0x28 + 0x28 == uVar5 + 0x28) {
      return '\0';
    }
    iVar4 = strcmp(*(char **)((long)list->unichar + (uVar5 - 0xc)),ovr->symname);
    uVar3 = uVar5 + 0x28;
  } while (iVar4 != 0);
  if (ovr->unichar[0] != L'\0') {
    *(wchar_t *)((long)list->unichar + uVar5 + 0x10) = ovr->unichar[4];
    uVar2 = *(undefined8 *)(ovr->unichar + 2);
    puVar1 = (undefined8 *)((long)list->unichar + uVar5);
    *puVar1 = *(undefined8 *)ovr->unichar;
    puVar1[1] = uVar2;
  }
  if (ovr->ch != 0) {
    *(short *)((long)list->unichar + uVar5 + 0x18) = ovr->ch;
  }
  if (ovr->color != -1) {
    *(int *)((long)list->unichar + (uVar5 - 4)) = ovr->color;
  }
  *(nh_bool *)((long)list->unichar + uVar5 + 0x1a) = cust;
  return '\x01';
}

Assistant:

static nh_bool apply_override_list(struct curses_symdef *list, int len,
				   const struct curses_symdef *ovr, nh_bool cust)
{
    int i;
    for (i = 0; i < len; i++)
	if (!strcmp(list[i].symname, ovr->symname)) {
	    if (ovr->unichar[0])
		memcpy(list[i].unichar, ovr->unichar, sizeof(wchar_t) * CCHARW_MAX);
	    if (ovr->ch)
		list[i].ch = ovr->ch;
	    if (ovr->color != -1)
		list[i].color = ovr->color;
	    list[i].custom = cust;
	    return TRUE;
	}
    return FALSE;
}